

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

ByteData * __thiscall
cfd::ConfidentialTransactionController::CreateSignatureHash
          (ByteData *__return_storage_ptr__,ConfidentialTransactionController *this,Txid *txid,
          uint32_t vout,Pubkey *pubkey,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  uint32_t txin_index;
  ByteData256 sighash;
  Script script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  SigHashType local_6c;
  Script local_60;
  
  core::ScriptUtil::CreateP2pkhLockingScript(&local_60,pubkey);
  txin_index = core::ConfidentialTransaction::GetTxInIndex(&this->transaction_,txid,vout);
  core::Script::GetData((ByteData *)&local_a0,&local_60);
  core::SigHashType::SigHashType(&local_6c,sighash_type);
  core::ConfidentialTransaction::GetElementsSignatureHash
            ((ByteData256 *)&local_88,&this->transaction_,txin_index,(ByteData *)&local_a0,&local_6c
             ,value,version);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  core::ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
             (ByteData256 *)&local_88);
  core::ByteData::ByteData
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  core::Script::~Script(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey,
    SigHashType sighash_type, const ConfidentialValue& value,
    WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetElementsSignatureHash(
      txin_index, script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}